

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  ObjectList *this_01;
  pointer *ppuVar1;
  pointer pRVar2;
  pointer puVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  _Bvector_impl *p_Var6;
  ulong in_RAX;
  Ref *pRVar7;
  _Base_ptr p_Var8;
  Object **ppOVar9;
  size_t i_1;
  size_type sVar10;
  Index i;
  ulong index;
  size_type __new_size;
  reference rVar11;
  _Bit_iterator __first;
  _Bit_iterator __last;
  undefined8 uStack_38;
  
  if ((this->gc_context_).call_depth != 0) {
    __assert_fail("gc_context_.call_depth == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                  ,0xfe,"void wabt::interp::Store::Collect()");
  }
  this_01 = &this->objects_;
  __new_size = (long)(this->objects_).list_.
                     super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->objects_).list_.
                     super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
  this_00 = &(this->gc_context_).marks;
  uStack_38 = in_RAX;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
  p_Var6 = &(this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar4 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar5 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar5;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
  uStack_38 = uStack_38 & 0xffffffffffffff;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,(bool *)((long)&uStack_38 + 7));
  for (index = 0;
      pRVar2 = (this->roots_).list_.
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_start,
      index < (ulong)((long)(this->roots_).list_.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3);
      index = index + 1) {
    if (-1 < (long)pRVar2[index].index) {
      pRVar7 = FreeList<wabt::interp::Ref>::Get(&this->roots_,index);
      Mark(this,(Ref)pRVar7->index);
    }
  }
  for (p_Var8 = (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->threads_)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    Thread::Mark(*(Thread **)(p_Var8 + 1));
  }
  while( true ) {
    puVar3 = (this->gc_context_).untraced_objects.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->gc_context_).untraced_objects.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == puVar3) {
      if ((this->gc_context_).call_depth == 0) {
        for (sVar10 = 0; __new_size != sVar10; sVar10 = sVar10 + 1) {
          if (((ulong)(this_01->list_).
                      super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar10] & 1) == 0) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar10);
            if ((*rVar11._M_p & rVar11._M_mask) == 0) {
              FreeList<wabt::interp::Object_*>::Delete(this_01,sVar10);
            }
          }
        }
        return;
      }
      __assert_fail("gc_context_.call_depth == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0x11a,"void wabt::interp::Store::Collect()");
    }
    sVar10 = puVar3[-1];
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar10);
    if ((*rVar11._M_p & rVar11._M_mask) == 0) {
      __assert_fail("gc_context_.marks[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0x113,"void wabt::interp::Store::Collect()");
    }
    if ((this->gc_context_).call_depth != 0) break;
    ppuVar1 = &(this->gc_context_).untraced_objects.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    ppOVar9 = FreeList<wabt::interp::Object_*>::Get(this_01,sVar10);
    (*(*ppOVar9)->_vptr_Object[2])(*ppOVar9,this);
  }
  __assert_fail("gc_context_.call_depth == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x114,"void wabt::interp::Store::Collect()");
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();

  assert(gc_context_.call_depth == 0);

  gc_context_.marks.resize(object_count);
  std::fill(gc_context_.marks.begin(), gc_context_.marks.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  for (auto thread : threads_) {
    thread->Mark();
  }

  // This vector is often empty since the default maximum
  // recursion is usually enough to mark all objects.
  while (WABT_UNLIKELY(!gc_context_.untraced_objects.empty())) {
    size_t index = gc_context_.untraced_objects.back();

    assert(gc_context_.marks[index]);
    assert(gc_context_.call_depth == 0);

    gc_context_.untraced_objects.pop_back();
    objects_.Get(index)->Mark(*this);
  }

  assert(gc_context_.call_depth == 0);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !gc_context_.marks[i]) {
      objects_.Delete(i);
    }
  }
}